

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O3

bool __thiscall roaring::Roaring64Map::isFull(Roaring64Map *this)

{
  uint64_t uVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  
  if ((this->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0x100000000) {
    p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = p_Var2;
    while (((_Rb_tree_header *)p_Var2 != p_Var3 &&
           (uVar1 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&p_Var2[1]._M_parent),
           p_Var4 = p_Var2, uVar1 == 0x100000000))) {
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      p_Var4 = &p_Var3->_M_header;
    }
    bVar5 = (_Rb_tree_header *)p_Var4 == p_Var3;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool isFull() const {
        // only bother to check if map is fully saturated
        //
        // we put std::numeric_limits<>::max/min in parentheses
        // to avoid a clash with the Windows.h header under Windows
        return roarings.size() ==
                       ((uint64_t)(std::numeric_limits<uint32_t>::max)()) + 1
                   ? std::all_of(roarings.cbegin(), roarings.cend(),
                                 [](const std::pair<const uint32_t, Roaring>
                                        &roaring_map_entry) {
                                     return roaring_map_entry.second.isFull();
                                 })
                   : false;
    }